

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O3

void __thiscall Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,int16_t v)

{
  uint8_t *d;
  int16_t *piVar1;
  
  this->type = 'Y';
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar1 = (int16_t *)operator_new(2);
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)piVar1;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(piVar1 + 1);
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(piVar1 + 1);
  *piVar1 = v;
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(int16_t v)
: type('Y')
, data(2) {
    uint8_t* d = data.data();
    (reinterpret_cast<int16_t*>(d))[0] = v;
}